

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O0

void __thiscall
DynamicGraph::dropLevel
          (DynamicGraph *this,Vertex w,list<unsigned_long,_std::allocator<unsigned_long>_> *queue,
          list<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
          *actions,list<unsigned_long,_std::allocator<unsigned_long>_> *incVertices)

{
  Edge e;
  Edge e_00;
  Edge e_01;
  Edge e_02;
  Edge e_03;
  Edge e_04;
  Edge e_05;
  Edge e_06;
  Edge e_07;
  list<unsigned_long,_std::allocator<unsigned_long>_> *plVar1;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  list<unsigned_long,_std::allocator<unsigned_long>_> *plVar5;
  Insert *pIVar6;
  Delete *pDVar7;
  reference peVar8;
  pair<std::_Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_bool>
  pVar9;
  unsigned_long local_2f8;
  unsigned_long local_240;
  Delete *local_210;
  _Self local_208;
  _Self local_200;
  iterator ei_6;
  Insert *local_1d0;
  _Self local_1c8;
  _Self local_1c0;
  iterator ei_5;
  Delete *local_1a0;
  _Self local_198;
  _Self local_190;
  iterator ei_4;
  Insert *local_160;
  unsigned_long local_158;
  unsigned_long uStack_150;
  property_type *local_148;
  Delete *local_138;
  unsigned_long local_130;
  Vertex ww_1;
  _Self local_120;
  iterator ei_3;
  Insert *local_f0;
  _Self local_e8;
  _Self local_e0;
  iterator ei_2;
  Delete *local_c0;
  _Self local_b8;
  _Self local_b0;
  iterator ei_1;
  Insert *local_80 [3];
  unsigned_long local_68;
  unsigned_long uStack_60;
  property_type *local_58;
  Delete *local_50;
  unsigned_long local_48;
  Vertex ww;
  _Self local_38;
  iterator ei;
  list<unsigned_long,_std::allocator<unsigned_long>_> *incVertices_local;
  list<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
  *actions_local;
  list<unsigned_long,_std::allocator<unsigned_long>_> *queue_local;
  Vertex w_local;
  DynamicGraph *this_local;
  
  ei._M_node = (_Base_ptr)incVertices;
  queue_local = (list<unsigned_long,_std::allocator<unsigned_long>_> *)w;
  w_local = (Vertex)this;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_front
            (incVertices,(value_type_conflict *)&queue_local);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&this->level,(size_type)queue_local);
  *pvVar3 = *pvVar3 + 1;
  pvVar4 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                     (&this->relatives,(size_type)queue_local);
  local_38._M_node =
       (_Base_ptr)
       std::
       set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
       ::begin(&pvVar4->b_sibl);
  while( true ) {
    pvVar4 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                       (&this->relatives,(size_type)queue_local);
    ww = (Vertex)std::
                 set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
                 ::end(&pvVar4->b_sibl);
    bVar2 = std::operator!=(&local_38,(_Self *)&ww);
    plVar1 = queue_local;
    if (!bVar2) break;
    peVar8 = std::
             _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>
             ::operator*(&local_38);
    plVar5 = (list<unsigned_long,_std::allocator<unsigned_long>_> *)
             boost::
             target<boost::undirected_tag,unsigned_long,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>
                       (&peVar8->super_edge_base<boost::undirected_tag,_unsigned_long>,
                        &this->super_UndirectedGraph);
    if (plVar1 == plVar5) {
      peVar8 = std::
               _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>
               ::operator*(&local_38);
      local_240 = boost::
                  source<boost::undirected_tag,unsigned_long,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>
                            (&peVar8->super_edge_base<boost::undirected_tag,_unsigned_long>,
                             &this->super_UndirectedGraph);
    }
    else {
      peVar8 = std::
               _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>
               ::operator*(&local_38);
      local_240 = boost::
                  target<boost::undirected_tag,unsigned_long,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>
                            (&peVar8->super_edge_base<boost::undirected_tag,_unsigned_long>,
                             &this->super_UndirectedGraph);
    }
    local_48 = local_240;
    pDVar7 = (Delete *)operator_new(0x28);
    pvVar4 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                       (&this->relatives,local_48);
    peVar8 = std::
             _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>
             ::operator*(&local_38);
    local_58 = peVar8->m_eproperty;
    local_68 = (peVar8->super_edge_base<boost::undirected_tag,_unsigned_long>).m_source;
    uStack_60 = (peVar8->super_edge_base<boost::undirected_tag,_unsigned_long>).m_target;
    e.super_edge_base<boost::undirected_tag,_unsigned_long> =
         peVar8->super_edge_base<boost::undirected_tag,_unsigned_long>;
    e.m_eproperty = peVar8->m_eproperty;
    Delete::Delete(pDVar7,&pvVar4->b_sibl,e);
    local_50 = pDVar7;
    std::__cxx11::
    list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
    ::emplace_front<Delete*>
              ((list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
                *)actions,&local_50);
    pvVar4 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                       (&this->relatives,local_48);
    peVar8 = std::
             _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>
             ::operator*(&local_38);
    std::
    set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
    ::erase(&pvVar4->b_sibl,peVar8);
    pIVar6 = (Insert *)operator_new(0x28);
    pvVar4 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                       (&this->relatives,local_48);
    peVar8 = std::
             _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>
             ::operator*(&local_38);
    e_00.super_edge_base<boost::undirected_tag,_unsigned_long> =
         peVar8->super_edge_base<boost::undirected_tag,_unsigned_long>;
    e_00.m_eproperty = peVar8->m_eproperty;
    Insert::Insert(pIVar6,&pvVar4->c_succ,e_00);
    local_80[0] = pIVar6;
    std::__cxx11::
    list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
    ::emplace_front<Insert*>
              ((list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
                *)actions,local_80);
    pvVar4 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                       (&this->relatives,local_48);
    peVar8 = std::
             _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>
             ::operator*(&local_38);
    pVar9 = std::
            set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
            ::insert(&pvVar4->c_succ,peVar8);
    ei_1._M_node = (_Base_ptr)pVar9.first._M_node;
    std::
    _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>::
    operator++(&local_38);
  }
  pvVar4 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                     (&this->relatives,(size_type)queue_local);
  local_b0._M_node =
       (_Base_ptr)
       std::
       set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
       ::begin(&pvVar4->a_pred);
  while( true ) {
    pvVar4 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                       (&this->relatives,(size_type)queue_local);
    local_b8._M_node =
         (_Base_ptr)
         std::
         set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
         ::end(&pvVar4->a_pred);
    bVar2 = std::operator!=(&local_b0,&local_b8);
    if (!bVar2) break;
    pDVar7 = (Delete *)operator_new(0x28);
    pvVar4 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                       (&this->relatives,(size_type)queue_local);
    peVar8 = std::
             _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>
             ::operator*(&local_b0);
    ei_2._M_node = (_Base_ptr)
                   (peVar8->super_edge_base<boost::undirected_tag,_unsigned_long>).m_source;
    e_01.super_edge_base<boost::undirected_tag,_unsigned_long> =
         peVar8->super_edge_base<boost::undirected_tag,_unsigned_long>;
    e_01.m_eproperty = peVar8->m_eproperty;
    Delete::Delete(pDVar7,&pvVar4->a_pred,e_01);
    local_c0 = pDVar7;
    std::__cxx11::
    list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
    ::emplace_front<Delete*>
              ((list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
                *)actions,&local_c0);
    std::
    _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>::
    operator++(&local_b0);
  }
  pvVar4 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                     (&this->relatives,(size_type)queue_local);
  std::
  set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  ::clear(&pvVar4->a_pred);
  pvVar4 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                     (&this->relatives,(size_type)queue_local);
  local_e0._M_node =
       (_Base_ptr)
       std::
       set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
       ::begin(&pvVar4->b_sibl);
  while( true ) {
    pvVar4 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                       (&this->relatives,(size_type)queue_local);
    local_e8._M_node =
         (_Base_ptr)
         std::
         set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
         ::end(&pvVar4->b_sibl);
    bVar2 = std::operator!=(&local_e0,&local_e8);
    if (!bVar2) break;
    pIVar6 = (Insert *)operator_new(0x28);
    pvVar4 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                       (&this->relatives,(size_type)queue_local);
    peVar8 = std::
             _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>
             ::operator*(&local_e0);
    e_02.super_edge_base<boost::undirected_tag,_unsigned_long> =
         peVar8->super_edge_base<boost::undirected_tag,_unsigned_long>;
    e_02.m_eproperty = peVar8->m_eproperty;
    Insert::Insert(pIVar6,&pvVar4->a_pred,e_02);
    local_f0 = pIVar6;
    std::__cxx11::
    list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
    ::emplace_front<Insert*>
              ((list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
                *)actions,&local_f0);
    pvVar4 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                       (&this->relatives,(size_type)queue_local);
    peVar8 = std::
             _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>
             ::operator*(&local_e0);
    pVar9 = std::
            set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
            ::insert(&pvVar4->a_pred,peVar8);
    ei_3._M_node = (_Base_ptr)pVar9.first._M_node;
    std::
    _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>::
    operator++(&local_e0);
  }
  pvVar4 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                     (&this->relatives,(size_type)queue_local);
  local_120._M_node =
       (_Base_ptr)
       std::
       set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
       ::begin(&pvVar4->c_succ);
  while( true ) {
    pvVar4 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                       (&this->relatives,(size_type)queue_local);
    ww_1 = (Vertex)std::
                   set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
                   ::end(&pvVar4->c_succ);
    bVar2 = std::operator!=(&local_120,(_Self *)&ww_1);
    plVar1 = queue_local;
    if (!bVar2) break;
    peVar8 = std::
             _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>
             ::operator*(&local_120);
    plVar5 = (list<unsigned_long,_std::allocator<unsigned_long>_> *)
             boost::
             target<boost::undirected_tag,unsigned_long,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>
                       (&peVar8->super_edge_base<boost::undirected_tag,_unsigned_long>,
                        &this->super_UndirectedGraph);
    if (plVar1 == plVar5) {
      peVar8 = std::
               _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>
               ::operator*(&local_120);
      local_2f8 = boost::
                  source<boost::undirected_tag,unsigned_long,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>
                            (&peVar8->super_edge_base<boost::undirected_tag,_unsigned_long>,
                             &this->super_UndirectedGraph);
    }
    else {
      peVar8 = std::
               _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>
               ::operator*(&local_120);
      local_2f8 = boost::
                  target<boost::undirected_tag,unsigned_long,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>
                            (&peVar8->super_edge_base<boost::undirected_tag,_unsigned_long>,
                             &this->super_UndirectedGraph);
    }
    local_130 = local_2f8;
    pDVar7 = (Delete *)operator_new(0x28);
    pvVar4 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                       (&this->relatives,local_130);
    peVar8 = std::
             _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>
             ::operator*(&local_120);
    local_148 = peVar8->m_eproperty;
    local_158 = (peVar8->super_edge_base<boost::undirected_tag,_unsigned_long>).m_source;
    uStack_150 = (peVar8->super_edge_base<boost::undirected_tag,_unsigned_long>).m_target;
    e_03.super_edge_base<boost::undirected_tag,_unsigned_long> =
         peVar8->super_edge_base<boost::undirected_tag,_unsigned_long>;
    e_03.m_eproperty = peVar8->m_eproperty;
    Delete::Delete(pDVar7,&pvVar4->a_pred,e_03);
    local_138 = pDVar7;
    std::__cxx11::
    list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
    ::emplace_front<Delete*>
              ((list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
                *)actions,&local_138);
    pvVar4 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                       (&this->relatives,local_130);
    peVar8 = std::
             _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>
             ::operator*(&local_120);
    std::
    set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
    ::erase(&pvVar4->a_pred,peVar8);
    pIVar6 = (Insert *)operator_new(0x28);
    pvVar4 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                       (&this->relatives,local_130);
    peVar8 = std::
             _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>
             ::operator*(&local_120);
    e_04.super_edge_base<boost::undirected_tag,_unsigned_long> =
         peVar8->super_edge_base<boost::undirected_tag,_unsigned_long>;
    e_04.m_eproperty = peVar8->m_eproperty;
    Insert::Insert(pIVar6,&pvVar4->b_sibl,e_04);
    local_160 = pIVar6;
    std::__cxx11::
    list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
    ::emplace_front<Insert*>
              ((list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
                *)actions,&local_160);
    pvVar4 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                       (&this->relatives,local_130);
    peVar8 = std::
             _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>
             ::operator*(&local_120);
    pVar9 = std::
            set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
            ::insert(&pvVar4->b_sibl,peVar8);
    ei_4._M_node = (_Base_ptr)pVar9.first._M_node;
    pvVar4 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                       (&this->relatives,local_130);
    bVar2 = std::
            set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
            ::empty(&pvVar4->a_pred);
    if (bVar2) {
      std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back(queue,&local_130)
      ;
    }
    std::
    _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>::
    operator++(&local_120);
  }
  pvVar4 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                     (&this->relatives,(size_type)queue_local);
  local_190._M_node =
       (_Base_ptr)
       std::
       set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
       ::begin(&pvVar4->b_sibl);
  while( true ) {
    pvVar4 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                       (&this->relatives,(size_type)queue_local);
    local_198._M_node =
         (_Base_ptr)
         std::
         set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
         ::end(&pvVar4->b_sibl);
    bVar2 = std::operator!=(&local_190,&local_198);
    if (!bVar2) break;
    pDVar7 = (Delete *)operator_new(0x28);
    pvVar4 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                       (&this->relatives,(size_type)queue_local);
    peVar8 = std::
             _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>
             ::operator*(&local_190);
    ei_5._M_node = (_Base_ptr)
                   (peVar8->super_edge_base<boost::undirected_tag,_unsigned_long>).m_source;
    e_05.super_edge_base<boost::undirected_tag,_unsigned_long> =
         peVar8->super_edge_base<boost::undirected_tag,_unsigned_long>;
    e_05.m_eproperty = peVar8->m_eproperty;
    Delete::Delete(pDVar7,&pvVar4->b_sibl,e_05);
    local_1a0 = pDVar7;
    std::__cxx11::
    list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
    ::emplace_front<Delete*>
              ((list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
                *)actions,&local_1a0);
    std::
    _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>::
    operator++(&local_190);
  }
  pvVar4 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                     (&this->relatives,(size_type)queue_local);
  std::
  set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  ::clear(&pvVar4->b_sibl);
  pvVar4 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                     (&this->relatives,(size_type)queue_local);
  local_1c0._M_node =
       (_Base_ptr)
       std::
       set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
       ::begin(&pvVar4->c_succ);
  while( true ) {
    pvVar4 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                       (&this->relatives,(size_type)queue_local);
    local_1c8._M_node =
         (_Base_ptr)
         std::
         set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
         ::end(&pvVar4->c_succ);
    bVar2 = std::operator!=(&local_1c0,&local_1c8);
    if (!bVar2) break;
    pIVar6 = (Insert *)operator_new(0x28);
    pvVar4 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                       (&this->relatives,(size_type)queue_local);
    peVar8 = std::
             _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>
             ::operator*(&local_1c0);
    e_06.super_edge_base<boost::undirected_tag,_unsigned_long> =
         peVar8->super_edge_base<boost::undirected_tag,_unsigned_long>;
    e_06.m_eproperty = peVar8->m_eproperty;
    Insert::Insert(pIVar6,&pvVar4->b_sibl,e_06);
    local_1d0 = pIVar6;
    std::__cxx11::
    list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
    ::emplace_front<Insert*>
              ((list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
                *)actions,&local_1d0);
    pvVar4 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                       (&this->relatives,(size_type)queue_local);
    peVar8 = std::
             _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>
             ::operator*(&local_1c0);
    pVar9 = std::
            set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
            ::insert(&pvVar4->b_sibl,peVar8);
    ei_6._M_node = (_Base_ptr)pVar9.first._M_node;
    std::
    _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>::
    operator++(&local_1c0);
  }
  pvVar4 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                     (&this->relatives,(size_type)queue_local);
  local_200._M_node =
       (_Base_ptr)
       std::
       set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
       ::begin(&pvVar4->c_succ);
  while( true ) {
    pvVar4 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                       (&this->relatives,(size_type)queue_local);
    local_208._M_node =
         (_Base_ptr)
         std::
         set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
         ::end(&pvVar4->c_succ);
    bVar2 = std::operator!=(&local_200,&local_208);
    if (!bVar2) break;
    pDVar7 = (Delete *)operator_new(0x28);
    pvVar4 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                       (&this->relatives,(size_type)queue_local);
    peVar8 = std::
             _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>
             ::operator*(&local_200);
    e_07.super_edge_base<boost::undirected_tag,_unsigned_long> =
         peVar8->super_edge_base<boost::undirected_tag,_unsigned_long>;
    e_07.m_eproperty = peVar8->m_eproperty;
    Delete::Delete(pDVar7,&pvVar4->c_succ,e_07);
    local_210 = pDVar7;
    std::__cxx11::
    list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
    ::emplace_front<Delete*>
              ((list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
                *)actions,&local_210);
    std::
    _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>::
    operator++(&local_200);
  }
  pvVar4 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                     (&this->relatives,(size_type)queue_local);
  std::
  set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  ::clear(&pvVar4->c_succ);
  pvVar4 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                     (&this->relatives,(size_type)queue_local);
  bVar2 = std::
          set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
          ::empty(&pvVar4->a_pred);
  if (bVar2) {
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (queue,(value_type_conflict *)&queue_local);
  }
  return;
}

Assistant:

void DynamicGraph::dropLevel(Vertex w, std::list<Vertex> &queue,
                             std::list<std::unique_ptr<Action>> &actions, std::list<Vertex> &incVertices)
{
    // Remove w from its level (say, Lj), and put it in the next level (Lj+1)
    incVertices.push_front(w);
    level[w]++;

    // For each edge e (w---w') in b_sibl(w)
    for(auto ei = relatives[w].b_sibl.begin(); ei != relatives[w].b_sibl.end(); ++ei) {
        Vertex ww = (w==target(*ei, *this)) ? source(*ei, *this) : target(*ei, *this);
        // remove e from b_sibl(w')
        actions.emplace_front(new Delete(relatives[ww].b_sibl, *ei));
        relatives[ww].b_sibl.erase(*ei);
        // and put it in c_succ(w')
        actions.emplace_front(new Insert(relatives[ww].c_succ, *ei));
        relatives[ww].c_succ.insert(*ei);
    }

    // a_pred(w) <- b_pred(w)
    for(auto ei = relatives[w].a_pred.begin(); ei != relatives[w].a_pred.end(); ++ei) {
        actions.emplace_front(new Delete(relatives[w].a_pred, *ei));
    }
    relatives[w].a_pred.clear();
    for(auto ei = relatives[w].b_sibl.begin(); ei != relatives[w].b_sibl.end(); ++ei) {
        actions.emplace_front(new Insert(relatives[w].a_pred, *ei));
        relatives[w].a_pred.insert(*ei);
    }

    // For each edge e (w---w') in c_succ(w)
    for(auto ei = relatives[w].c_succ.begin(); ei != relatives[w].c_succ.end(); ++ei) {
        Vertex ww = (w==target(*ei, *this)) ? source(*ei, *this) : target(*ei, *this);
        // remove e from a_pred(w')
        actions.emplace_front(new Delete(relatives[ww].a_pred, *ei));
        relatives[ww].a_pred.erase(*ei);
        // and put it in b_sibl(w');
        actions.emplace_front(new Insert(relatives[ww].b_sibl, *ei));
        relatives[ww].b_sibl.insert(*ei);
        // if the new a_pred(w') is empty, put w' on Q.
        if(relatives[ww].a_pred.empty()) {
            queue.push_back(ww);
        }
    }

    // b_sibl(w) <- c_succ(w)
    for(auto ei = relatives[w].b_sibl.begin(); ei != relatives[w].b_sibl.end(); ++ei) {
        actions.emplace_front(new Delete(relatives[w].b_sibl, *ei));
    }
    relatives[w].b_sibl.clear();
    for(auto ei = relatives[w].c_succ.begin(); ei != relatives[w].c_succ.end(); ++ei) {
        actions.emplace_front(new Insert(relatives[w].b_sibl, *ei));
        relatives[w].b_sibl.insert(*ei);
    }

    // c_succ(w) <- {empty}
    for(auto ei = relatives[w].c_succ.begin(); ei != relatives[w].c_succ.end(); ++ei) {
        actions.emplace_front(new Delete(relatives[w].c_succ, *ei));
    }
    relatives[w].c_succ.clear();

    // If a_pred(w) is empty, put w on Q.
    if(relatives[w].a_pred.empty()) {
        queue.push_back(w);
    }
}